

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ModuleDestroy(void *pCtx)

{
  Fts5Auxiliary *pFVar1;
  Fts5TokenizerModule *pFVar2;
  Fts5Global *pGlobal;
  Fts5Auxiliary *pNextAux;
  Fts5Auxiliary *pAux;
  Fts5TokenizerModule *pNextTok;
  Fts5TokenizerModule *pTok;
  void *pCtx_local;
  
  pNextAux = *(Fts5Auxiliary **)((long)pCtx + 0x30);
  while (pNextAux != (Fts5Auxiliary *)0x0) {
    pFVar1 = pNextAux->pNext;
    if (pNextAux->xDestroy != (_func_void_void_ptr *)0x0) {
      (*pNextAux->xDestroy)(pNextAux->pUserData);
    }
    sqlite3_free(pNextAux);
    pNextAux = pFVar1;
  }
  pNextTok = *(Fts5TokenizerModule **)((long)pCtx + 0x38);
  while (pNextTok != (Fts5TokenizerModule *)0x0) {
    pFVar2 = pNextTok->pNext;
    if (pNextTok->xDestroy != (_func_void_void_ptr *)0x0) {
      (*pNextTok->xDestroy)(pNextTok->pUserData);
    }
    sqlite3_free(pNextTok);
    pNextTok = pFVar2;
  }
  sqlite3_free(pCtx);
  return;
}

Assistant:

static void fts5ModuleDestroy(void *pCtx){
  Fts5TokenizerModule *pTok, *pNextTok;
  Fts5Auxiliary *pAux, *pNextAux;
  Fts5Global *pGlobal = (Fts5Global*)pCtx;

  for(pAux=pGlobal->pAux; pAux; pAux=pNextAux){
    pNextAux = pAux->pNext;
    if( pAux->xDestroy ) pAux->xDestroy(pAux->pUserData);
    sqlite3_free(pAux);
  }

  for(pTok=pGlobal->pTok; pTok; pTok=pNextTok){
    pNextTok = pTok->pNext;
    if( pTok->xDestroy ) pTok->xDestroy(pTok->pUserData);
    sqlite3_free(pTok);
  }

  sqlite3_free(pGlobal);
}